

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<pstore::command_line::option_*,_void> * __thiscall
pstore::maybe<pstore::command_line::option*,void>::operator=
          (maybe<pstore::command_line::option*,void> *this,option **other)

{
  option *poVar1;
  option **ppoVar2;
  
  if (*this == (maybe<pstore::command_line::option*,void>)0x1) {
    poVar1 = *other;
    ppoVar2 = value_impl<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::option*>
                        ((maybe<pstore::command_line::option_*,_void> *)this);
    *ppoVar2 = poVar1;
  }
  else {
    *(option **)(this + 8) = *other;
    *this = (maybe<pstore::command_line::option*,void>)0x1;
  }
  return (maybe<pstore::command_line::option_*,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }